

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O2

void test_max_min(void)

{
  bitset_t *bitset;
  size_t sVar1;
  size_t i;
  bool bVar2;
  undefined8 uStack_30;
  
  bitset = bitset_create();
  i = 300;
  while( true ) {
    if (i + 3 == 0xbbb) {
      bitset_free(bitset);
      return;
    }
    bitset_set(bitset,i);
    sVar1 = bitset_minimum(bitset);
    if (sVar1 != 300) break;
    sVar1 = bitset_maximum(bitset);
    bVar2 = i != sVar1;
    i = i + 3;
    if (bVar2) {
      uStack_30 = 0x3f;
LAB_0010151b:
      fprintf(_stderr,"Assertion failed in %s at line %d\n","test_max_min",uStack_30);
      exit(1);
    }
  }
  uStack_30 = 0x3e;
  goto LAB_0010151b;
}

Assistant:

void test_max_min() {
  bitset_t *b = bitset_create();
  for (size_t k = 100; k < 1000; ++k) {
    bitset_set(b, 3 * k);
    TEST_ASSERT(bitset_minimum(b) == 3 * 100);
    TEST_ASSERT(bitset_maximum(b) == 3 * k);
  }
  bitset_free(b);
}